

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

TPZManVector<long,_4> * __thiscall
TPZManVector<long,_4>::operator=(TPZManVector<long,_4> *this,TPZManVector<long,_4> *copy)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this == copy) {
    return this;
  }
  uVar5 = (copy->super_TPZVec<long>).fNElements;
  lVar2 = (this->super_TPZVec<long>).fNAlloc;
  if ((lVar2 < (long)uVar5) &&
     (plVar3 = (this->super_TPZVec<long>).fStore, plVar3 != this->fExtAlloc && plVar3 != (long *)0x0
     )) {
    operator_delete__(plVar3);
    (this->super_TPZVec<long>).fStore = (long *)0x0;
    (this->super_TPZVec<long>).fNAlloc = 0;
    lVar2 = 0;
  }
  if ((long)uVar5 < 5) {
    plVar1 = (this->super_TPZVec<long>).fStore;
    plVar3 = this->fExtAlloc;
    if (plVar1 != (long *)0x0 && plVar1 != plVar3) {
      operator_delete__(plVar1);
    }
    (this->super_TPZVec<long>).fNAlloc = 0;
    (this->super_TPZVec<long>).fStore = plVar3;
  }
  else {
    if ((long)uVar5 <= lVar2) {
      (this->super_TPZVec<long>).fNElements = uVar5;
      plVar3 = (this->super_TPZVec<long>).fStore;
      goto LAB_00ffdfa4;
    }
    plVar3 = (long *)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8);
    (this->super_TPZVec<long>).fStore = plVar3;
    (this->super_TPZVec<long>).fNAlloc = uVar5;
  }
  (this->super_TPZVec<long>).fNElements = uVar5;
LAB_00ffdfa4:
  plVar1 = (copy->super_TPZVec<long>).fStore;
  uVar4 = 0;
  if ((long)uVar5 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    plVar3[uVar4] = plVar1[uVar4];
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}